

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vq.c
# Opt level: O2

float prune_distance(float *x,float *y,int Ndim,float mindist)

{
  long lVar1;
  float fVar2;
  
  fVar2 = (*x - *y) * (*x - *y);
  lVar1 = 1;
  do {
    if (Ndim <= (int)lVar1) {
      return fVar2;
    }
    fVar2 = fVar2 + (x[lVar1] - y[lVar1]) * (x[lVar1] - y[lVar1]);
    lVar1 = lVar1 + 1;
  } while (fVar2 <= mindist);
  return fVar2;
}

Assistant:

float prune_distance(float *x, float *y, int Ndim, float mindist)
{
	auto int i;
	auto float dist, t;

	t = *x++ - *y++;
	dist = t * t;
	for (i = 1; i < Ndim; ++i) {
		t = *x++ - *y++;
		dist += t * t;
		if (dist > mindist)
			break;
	}
	return (dist);
}